

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O0

void __thiscall
TPZTensor<TFad<6,_double>_>::EigenSystem
          (TPZTensor<TFad<6,_double>_> *this,TPZDecomposed *eigensystem)

{
  TPZManVector<TFad<6,_double>,_3> *pTVar1;
  int64_t iVar2;
  int **ppiVar3;
  int *piVar4;
  TPZTensor<TFad<6,_double>_> *pTVar5;
  TPZTensor<TFad<6,_double>_> *pTVar6;
  TPZTensor<TFad<6,_double>_> *source;
  long in_RSI;
  int i_2;
  int *__end2_1;
  int *__begin2_1;
  TPZStack<int,_3> *__range2_1;
  int i_1;
  int *__end2;
  int *__begin2;
  TPZStack<int,_3> *__range2;
  TPZTensor<TFad<6,_double>_> sum;
  uint k;
  uint j;
  uint i;
  TPZStack<int,_3> indices_to_add;
  TFad<6,_double> tol;
  TFad<6,_double> precision;
  TPZManVector<TPZTensor<TFad<6,_double>_>,_3> *eigentensors;
  TPZManVector<TFad<6,_double>,_3> *eigenvalues;
  TPZDecomposed *in_stack_00000c98;
  TPZTensor<TFad<6,_double>_> *in_stack_00000ca0;
  int64_t in_stack_fffffffffffffc48;
  TFad<6,_double> *in_stack_fffffffffffffc50;
  TPZTensor<TFad<6,_double>_> *in_stack_fffffffffffffc58;
  TFad<6,_double> *in_stack_fffffffffffffc60;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *in_stack_fffffffffffffc78;
  TFad<6,_double> *in_stack_fffffffffffffc80;
  TPZTensor<TFad<6,_double>_> *in_stack_fffffffffffffc88;
  TPZTensor<TFad<6,_double>_> *in_stack_fffffffffffffcb0;
  TPZTensor<TFad<6,_double>_> *local_328;
  int *local_308;
  TPZTensor<TFad<6,_double>_> *in_stack_fffffffffffffd78;
  uint local_13c;
  uint local_138;
  uint local_134;
  TPZVec<int> local_130 [8];
  TPZVec<TPZTensor<TFad<6,_double>_>_> *local_20;
  long local_18;
  long local_10;
  
  local_18 = in_RSI + 0x38;
  local_20 = (TPZVec<TPZTensor<TFad<6,_double>_>_> *)(in_RSI + 0x3d8);
  local_10 = in_RSI;
  TFad<6,_double>::TFad(in_stack_fffffffffffffc50);
  ZeroTolerance<6,double>((TFad<6,_double> *)0x14b08fa);
  Norm(in_stack_fffffffffffffd78);
  ::operator*((TFad<6,_double> *)in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  TFad<6,double>::TFad<TFadBinaryMul<TFad<6,double>,TFad<6,double>>>
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b0953);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14b0960);
  ComputeEigenvectors(in_stack_00000ca0,in_stack_00000c98);
  TPZStack<int,_3>::TPZStack((TPZStack<int,_3> *)in_stack_fffffffffffffc60);
  for (local_134 = 0; local_134 < 3; local_134 = local_134 + 1) {
    in_stack_fffffffffffffcb0 =
         (TPZTensor<TFad<6,_double>_> *)
         TPZVec<unsigned_int>::operator[]((TPZVec<unsigned_int> *)(local_10 + 8),(ulong)local_134);
    if (*(uint *)&(in_stack_fffffffffffffcb0->super_TPZSavable)._vptr_TPZSavable != 1) {
      TPZStack<int,_3>::push_back
                ((TPZStack<int,_3> *)in_stack_fffffffffffffc50,
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20));
    }
    for (local_138 = 0; local_138 < 3; local_138 = local_138 + 1) {
      for (local_13c = local_138; local_13c < 3; local_13c = local_13c + 1) {
        pTVar1 = TPZVec<TPZManVector<TFad<6,_double>,_3>_>::operator[]
                           ((TPZVec<TPZManVector<TFad<6,_double>,_3>_> *)(local_10 + 0x118),
                            (ulong)local_134);
        TPZVec<TFad<6,_double>_>::operator[]
                  (&pTVar1->super_TPZVec<TFad<6,_double>_>,(ulong)local_138);
        pTVar1 = TPZVec<TPZManVector<TFad<6,_double>,_3>_>::operator[]
                           ((TPZVec<TPZManVector<TFad<6,_double>,_3>_> *)(local_10 + 0x118),
                            (ulong)local_134);
        TPZVec<TFad<6,_double>_>::operator[]
                  (&pTVar1->super_TPZVec<TFad<6,_double>_>,(ulong)local_13c);
        ::operator*((TFad<6,_double> *)in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
        in_stack_fffffffffffffc88 =
             TPZVec<TPZTensor<TFad<6,_double>_>_>::operator[](local_20,(ulong)local_134);
        in_stack_fffffffffffffc80 =
             operator()(in_stack_fffffffffffffc58,(int64_t)in_stack_fffffffffffffc50,
                        in_stack_fffffffffffffc48);
        TFad<6,double>::operator=
                  (in_stack_fffffffffffffc60,
                   (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
                   in_stack_fffffffffffffc58);
        TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
                  ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b0ba5);
      }
    }
  }
  iVar2 = TPZVec<int>::size(local_130);
  if (0 < iVar2) {
    TPZTensor(in_stack_fffffffffffffcb0);
    ppiVar3 = TPZVec<int>::begin(local_130);
    local_308 = *ppiVar3;
    piVar4 = TPZVec<int>::end(local_130);
    for (; local_308 != piVar4; local_308 = local_308 + 1) {
      pTVar5 = TPZVec<TPZTensor<TFad<6,_double>_>_>::operator[](local_20,(long)*local_308);
      operator+=(pTVar5,in_stack_fffffffffffffc58);
    }
    ppiVar3 = TPZVec<int>::begin(local_130);
    local_328 = (TPZTensor<TFad<6,_double>_> *)*ppiVar3;
    pTVar6 = (TPZTensor<TFad<6,_double>_> *)TPZVec<int>::end(local_130);
    pTVar5 = pTVar6;
    for (; local_328 != pTVar6;
        local_328 = (TPZTensor<TFad<6,_double>_> *)
                    ((long)&(local_328->super_TPZSavable)._vptr_TPZSavable + 4)) {
      source = TPZVec<TPZTensor<TFad<6,_double>_>_>::operator[]
                         (local_20,(long)*(int *)&(local_328->super_TPZSavable)._vptr_TPZSavable);
      operator=(pTVar5,source);
    }
    ~TPZTensor((TPZTensor<TFad<6,_double>_> *)0x14b0df4);
  }
  TPZStack<int,_3>::~TPZStack((TPZStack<int,_3> *)0x14b0e01);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14b0e0e);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14b0e1b);
  return;
}

Assistant:

void TPZTensor<T>::EigenSystem(TPZDecomposed &eigensystem)const {
    TPZManVector<T, 3> &eigenvalues = eigensystem.fEigenvalues;
    TPZManVector<TPZTensor<T>, 3> &eigentensors = eigensystem.fEigentensors;

    T precision;
    ZeroTolerance(precision);
    T tol = Norm()*precision;
    ComputeEigenvectors(eigensystem);

    TPZStack<int, 3> indices_to_add;
    for (unsigned int i = 0; i < 3; ++i) {
        if (eigensystem.fGeometricMultiplicity[i] != 1) {
            indices_to_add.push_back(i);
        }
        for (unsigned int j = 0; j < 3; ++j) {
            for (unsigned int k = j; k < 3; ++k) {
                eigentensors[i](j, k) = eigensystem.fEigenvectors[i][j] * eigensystem.fEigenvectors[i][k];
            }
        }
    }
    if (indices_to_add.size() > 0) {
        TPZTensor<T> sum;
        for (auto i : indices_to_add) {
            sum += eigentensors[i];
        }
        for (auto i : indices_to_add) {
            eigentensors[i] = sum;
        }
    }
#ifdef PZDEBUG
    TPZTensor<T> total;
    unsigned int i;
    for (i = 0; i < 3; i += eigensystem.fGeometricMultiplicity[i]) {
        total.Add(eigentensors[i], eigenvalues[i]);
    }
    if (i != 3) {
        std::cout << "Tensor decomposition error: " << std::endl;
        std::cout << "Incorrect total geometric multiplicity: " << i << std::endl;
        DebugStop();
    }
    for (unsigned int i = 0; i < 6; ++i) {
        if (!AreEqual(total[i], this->operator[](i), tol)) {
            std::cout << std::setprecision(15);
            std::cout << "Tensor decomposition error: " << std::endl;
            std::cout << "Original Tensor: ";
            this->Print(std::cout);
            std::cout << "Reconstruction from decomposition: ";
            total.Print(std::cout);
            std::cout << "Decomposition: " << std::endl;
            eigensystem.Print(std::cout);
            DebugStop();
        }
    }
#endif
}